

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate.cpp
# Opt level: O0

int main(void)

{
  short sVar1;
  int iVar2;
  ostream *poVar3;
  short _z;
  short *__end1;
  short *__begin1;
  short (*__range1) [3];
  int ix;
  D EG;
  
  EG.z[0] = 0;
  EG.z[1] = 0;
  EG.super_B.x._0_2_ = 4;
  EG.super_B.x._2_2_ = 6;
  EG.super_B.y._0_2_ = 9;
  std::operator<<((ostream *)&std::cout,"\nThese are the contents.\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"EG.x = \t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2a);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<((ostream *)&std::cout,"EG.y = \t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x35);
  std::operator<<(poVar3,'\n');
  __range1._0_4_ = 0;
  for (__end1 = (short *)&EG; __end1 != (short *)((long)&EG.super_B.y + 2); __end1 = __end1 + 1) {
    sVar1 = *__end1;
    poVar3 = std::operator<<((ostream *)&std::cout,"Z[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)__range1);
    poVar3 = std::operator<<(poVar3,"] = \t");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar1);
    std::operator<<(poVar3,'\n');
    __range1._0_4_ = (int)__range1 + 1;
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  iVar2._0_2_ = EG.z[0];
  iVar2._2_2_ = EG.z[1];
  return iVar2;
}

Assistant:

int main() {
	D EG{ {42, 53}, {4,6,9} };
	std::cout << "\nThese are the contents.\n";

	std::cout<<"EG.x = \t" << EG.x << '\n';
	std::cout<<"EG.y = \t" << EG.y << '\n';

	int ix =0;
	for (short _z : EG.z) {
		std::cout<<"Z[" << ix << "] = \t" << _z << '\n';
		ix++;
	}
	std::cout << std::endl;
}